

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataconvertergenerator.cpp
# Opt level: O0

string * __thiscall
DataConverterGenerator::functionToString_abi_cxx11_
          (string *__return_storage_ptr__,DataConverterGenerator *this,int converterIndex)

{
  bool bVar1;
  int *arg;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  int local_44;
  undefined1 local_40 [8];
  string indexString;
  int converterIndex_local;
  DataConverterGenerator *this_local;
  string *functionCode;
  
  indexString.field_2._M_local_buf[0xb] = '\0';
  indexString.field_2._12_4_ = converterIndex;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_44 = indexString.field_2._12_4_ + 1;
  boost::lexical_cast<std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (boost *)&local_44,arg);
  getConverterFunction_abi_cxx11_(&local_78,this,indexString.field_2._12_4_);
  bVar1 = std::operator==(&local_78,"deg_to_rad");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::operator+(&local_f8,"      mux",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_d8,&local_f8,".get(i) = mux");
    std::operator+(&local_b8,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_98,&local_b8,".get(i).asDouble() / (180/3.1415926);\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    bVar1 = getConverterVerbose(this,indexString.field_2._12_4_);
    if (bVar1) {
      std::operator+(&local_138,"      std::cout << \"value on index \" << i << \": \" << mux",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_118,&local_138,".get(i).asDouble() << std::endl;\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  else {
    getConverterFunction_abi_cxx11_(&local_158,this,indexString.field_2._12_4_);
    bVar1 = std::operator==(&local_158,"none_double");
    std::__cxx11::string::~string((string *)&local_158);
    if (bVar1) {
      std::operator+(&local_1d8,"      mux",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_1b8,&local_1d8,".get(i) = mux");
      std::operator+(&local_198,&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_178,&local_198,".get(i).asDouble();\n");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      bVar1 = getConverterVerbose(this,indexString.field_2._12_4_);
      if (bVar1) {
        std::operator+(&local_218,"      std::cout << \"value on index \" << i << \": \" << mux",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_1f8,&local_218,".get(i).asDouble() << std::endl;\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
      }
    }
    else {
      getConverterFunction_abi_cxx11_(&local_238,this,indexString.field_2._12_4_);
      bVar1 = std::operator==(&local_238,"none");
      std::__cxx11::string::~string((string *)&local_238);
      if (bVar1) {
        bVar1 = getConverterVerbose(this,indexString.field_2._12_4_);
        if (bVar1) {
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,
                     "      std::cout << \"Dummy break. Sorry for my laziness.\" << std::endl;\n");
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"      break;\n");
      }
    }
  }
  indexString.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((indexString.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataConverterGenerator::functionToString(int converterIndex) { // >data[6] / (180/3.1415926));
  std::string functionCode;
  std::string indexString = boost::lexical_cast<std::string>(converterIndex + 1);

  if(getConverterFunction(converterIndex) == "deg_to_rad") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble() / (180/3.1415926);\n";
    if(getConverterVerbose(converterIndex)) {
      functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
    }
  } else if(getConverterFunction(converterIndex) == "none_double") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble();\n";
      if(getConverterVerbose(converterIndex)) {
        functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
      }
    } else if(getConverterFunction(converterIndex) == "none") {
        // do nothing
        if(getConverterVerbose(converterIndex)) {
          functionCode += "      std::cout << \"Dummy break. Sorry for my laziness.\" << std::endl;\n";
        }
        functionCode += "      break;\n";
      }

  return functionCode;
 }